

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

void testing::internal::ParseGoogleTestFlagsOnlyImpl<char>(int *argc,char **argv)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  char **in_RDX;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  char **extraout_RDX_05;
  char **extraout_RDX_06;
  char **extraout_RDX_07;
  char **extraout_RDX_08;
  char **extraout_RDX_09;
  char **extraout_RDX_10;
  char **extraout_RDX_11;
  char **extraout_RDX_12;
  char **extraout_RDX_13;
  char **extraout_RDX_14;
  char **extraout_RDX_15;
  char **extraout_RDX_16;
  char **extraout_RDX_17;
  char **extraout_RDX_18;
  char **extraout_RDX_19;
  char **extraout_RDX_20;
  char **extraout_RDX_21;
  ulong uVar5;
  _Alloc_hider _Var6;
  int j;
  uint uVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  string arg_string;
  string local_50;
  
  _Var6._M_p = (pointer)argc;
  if (1 < *argc) {
    uVar7 = 1;
    do {
      StreamableToString<char*>(&local_50,(internal *)(argv + (int)uVar7),in_RDX);
      _Var6._M_p = local_50._M_dataplus._M_p;
      bVar3 = ParseBoolFlag(local_50._M_dataplus._M_p,"also_run_disabled_tests",
                            (bool *)&FLAGS_gtest_also_run_disabled_tests);
      in_RDX = extraout_RDX;
      if (((((bVar3) ||
            (bVar3 = ParseBoolFlag(_Var6._M_p,"break_on_failure",
                                   (bool *)&FLAGS_gtest_break_on_failure), in_RDX = extraout_RDX_00,
            bVar3)) ||
           (bVar3 = ParseBoolFlag(_Var6._M_p,"catch_exceptions",
                                  (bool *)&FLAGS_gtest_catch_exceptions), in_RDX = extraout_RDX_01,
           bVar3)) ||
          (((bVar3 = ParseStringFlag(_Var6._M_p,"color",(string *)&FLAGS_gtest_color_abi_cxx11_),
            in_RDX = extraout_RDX_02, bVar3 ||
            (bVar3 = ParseStringFlag(_Var6._M_p,"death_test_style",
                                     (string *)FLAGS_gtest_death_test_style_abi_cxx11_),
            in_RDX = extraout_RDX_03, bVar3)) ||
           ((bVar3 = ParseBoolFlag(_Var6._M_p,"death_test_use_fork",
                                   (bool *)&FLAGS_gtest_death_test_use_fork),
            in_RDX = extraout_RDX_04, bVar3 ||
            ((bVar3 = ParseStringFlag(_Var6._M_p,"filter",(string *)&FLAGS_gtest_filter_abi_cxx11_),
             in_RDX = extraout_RDX_05, bVar3 ||
             (bVar3 = ParseStringFlag(_Var6._M_p,"internal_run_death_test",
                                      (string *)&FLAGS_gtest_internal_run_death_test_abi_cxx11_),
             in_RDX = extraout_RDX_06, bVar3)))))))) ||
         ((bVar3 = ParseBoolFlag(_Var6._M_p,"list_tests",(bool *)&FLAGS_gtest_list_tests),
          in_RDX = extraout_RDX_07, bVar3 ||
          (((((bVar3 = ParseStringFlag(_Var6._M_p,"output",(string *)&FLAGS_gtest_output_abi_cxx11_)
              , in_RDX = extraout_RDX_08, bVar3 ||
              (bVar3 = ParseBoolFlag(_Var6._M_p,"print_time",(bool *)&FLAGS_gtest_print_time),
              in_RDX = extraout_RDX_09, bVar3)) ||
             (bVar3 = ParseInt32Flag(_Var6._M_p,"random_seed",&FLAGS_gtest_random_seed),
             in_RDX = extraout_RDX_10, bVar3)) ||
            ((bVar3 = ParseInt32Flag(_Var6._M_p,"repeat",&FLAGS_gtest_repeat),
             in_RDX = extraout_RDX_11, bVar3 ||
             (bVar3 = ParseBoolFlag(_Var6._M_p,"shuffle",(bool *)&FLAGS_gtest_shuffle),
             in_RDX = extraout_RDX_12, bVar3)))) ||
           ((bVar3 = ParseInt32Flag(_Var6._M_p,"stack_trace_depth",&FLAGS_gtest_stack_trace_depth),
            in_RDX = extraout_RDX_13, bVar3 ||
            ((bVar3 = ParseStringFlag(_Var6._M_p,"stream_result_to",
                                      (string *)&FLAGS_gtest_stream_result_to_abi_cxx11_),
             in_RDX = extraout_RDX_14, bVar3 ||
             (bVar3 = ParseBoolFlag(_Var6._M_p,"throw_on_failure",
                                    (bool *)&FLAGS_gtest_throw_on_failure), in_RDX = extraout_RDX_15
             , bVar3)))))))))) {
        auVar8 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        uVar1 = *argc;
        if (uVar7 != uVar1) {
          uVar5 = 0;
          auVar9 = vpbroadcastq_avx512f();
          in_RDX = argv + (long)(int)uVar7 + 1;
          do {
            auVar10 = vpbroadcastq_avx512f();
            auVar10 = vporq_avx512f(auVar10,auVar8);
            uVar2 = vpcmpuq_avx512f(auVar10,auVar9,2);
            auVar10 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDX + uVar5));
            auVar11._8_8_ = (ulong)((byte)(uVar2 >> 1) & 1) * auVar10._8_8_;
            auVar11._0_8_ = (ulong)((byte)uVar2 & 1) * auVar10._0_8_;
            auVar11._16_8_ = (ulong)((byte)(uVar2 >> 2) & 1) * auVar10._16_8_;
            auVar11._24_8_ = (ulong)((byte)(uVar2 >> 3) & 1) * auVar10._24_8_;
            auVar11._32_8_ = (ulong)((byte)(uVar2 >> 4) & 1) * auVar10._32_8_;
            auVar11._40_8_ = (ulong)((byte)(uVar2 >> 5) & 1) * auVar10._40_8_;
            auVar11._48_8_ = (ulong)((byte)(uVar2 >> 6) & 1) * auVar10._48_8_;
            auVar11._56_8_ = (uVar2 >> 7) * auVar10._56_8_;
            auVar10 = vmovdqu64_avx512f(auVar11);
            *(undefined1 (*) [64])(in_RDX + (uVar5 - 1)) = auVar10;
            uVar5 = uVar5 + 8;
          } while (((ulong)(~uVar7 + uVar1) + 8 & 0xfffffffffffffff8) != uVar5);
        }
        uVar7 = uVar7 - 1;
        *argc = uVar1 - 1;
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_50);
        in_RDX = extraout_RDX_17;
        if ((((iVar4 == 0) ||
             (iVar4 = std::__cxx11::string::compare((char *)&local_50), in_RDX = extraout_RDX_18,
             iVar4 == 0)) ||
            (iVar4 = std::__cxx11::string::compare((char *)&local_50), in_RDX = extraout_RDX_19,
            iVar4 == 0)) ||
           ((iVar4 = std::__cxx11::string::compare((char *)&local_50), in_RDX = extraout_RDX_20,
            iVar4 == 0 ||
            (bVar3 = HasGoogleTestFlagPrefix((char *)0x4c43c0), in_RDX = extraout_RDX_21, bVar3))))
        {
          g_help_flag = '\x01';
        }
      }
      _Var6._M_p = local_50._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        in_RDX = extraout_RDX_16;
      }
      uVar7 = uVar7 + 1;
    } while ((int)uVar7 < *argc);
  }
  if (g_help_flag != '\0') {
    PrintColorEncoded(_Var6._M_p);
  }
  return;
}

Assistant:

void ParseGoogleTestFlagsOnlyImpl(int* argc, CharType** argv) {
  for (int i = 1; i < *argc; i++) {
    const std::string arg_string = StreamableToString(argv[i]);
    const char* const arg = arg_string.c_str();

    using internal::ParseBoolFlag;
    using internal::ParseInt32Flag;
    using internal::ParseStringFlag;

    // Do we see a Google Test flag?
    if (ParseBoolFlag(arg, kAlsoRunDisabledTestsFlag,
                      &GTEST_FLAG(also_run_disabled_tests)) ||
        ParseBoolFlag(arg, kBreakOnFailureFlag,
                      &GTEST_FLAG(break_on_failure)) ||
        ParseBoolFlag(arg, kCatchExceptionsFlag,
                      &GTEST_FLAG(catch_exceptions)) ||
        ParseStringFlag(arg, kColorFlag, &GTEST_FLAG(color)) ||
        ParseStringFlag(arg, kDeathTestStyleFlag,
                        &GTEST_FLAG(death_test_style)) ||
        ParseBoolFlag(arg, kDeathTestUseFork,
                      &GTEST_FLAG(death_test_use_fork)) ||
        ParseStringFlag(arg, kFilterFlag, &GTEST_FLAG(filter)) ||
        ParseStringFlag(arg, kInternalRunDeathTestFlag,
                        &GTEST_FLAG(internal_run_death_test)) ||
        ParseBoolFlag(arg, kListTestsFlag, &GTEST_FLAG(list_tests)) ||
        ParseStringFlag(arg, kOutputFlag, &GTEST_FLAG(output)) ||
        ParseBoolFlag(arg, kPrintTimeFlag, &GTEST_FLAG(print_time)) ||
        ParseInt32Flag(arg, kRandomSeedFlag, &GTEST_FLAG(random_seed)) ||
        ParseInt32Flag(arg, kRepeatFlag, &GTEST_FLAG(repeat)) ||
        ParseBoolFlag(arg, kShuffleFlag, &GTEST_FLAG(shuffle)) ||
        ParseInt32Flag(arg, kStackTraceDepthFlag,
                       &GTEST_FLAG(stack_trace_depth)) ||
        ParseStringFlag(arg, kStreamResultToFlag,
                        &GTEST_FLAG(stream_result_to)) ||
        ParseBoolFlag(arg, kThrowOnFailureFlag,
                      &GTEST_FLAG(throw_on_failure))
        ) {
      // Yes.  Shift the remainder of the argv list left by one.  Note
      // that argv has (*argc + 1) elements, the last one always being
      // NULL.  The following loop moves the trailing NULL element as
      // well.
      for (int j = i; j != *argc; j++) {
        argv[j] = argv[j + 1];
      }

      // Decrements the argument count.
      (*argc)--;

      // We also need to decrement the iterator as we just removed
      // an element.
      i--;
    } else if (arg_string == "--help" || arg_string == "-h" ||
               arg_string == "-?" || arg_string == "/?" ||
               HasGoogleTestFlagPrefix(arg)) {
      // Both help flag and unrecognized Google Test flags (excluding
      // internal ones) trigger help display.
      g_help_flag = true;
    }
  }

  if (g_help_flag) {
    // We print the help here instead of in RUN_ALL_TESTS(), as the
    // latter may not be called at all if the user is using Google
    // Test with another testing framework.
    PrintColorEncoded(kColorEncodedHelpMessage);
  }
}